

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_absdif_b(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  undefined4 in_ECX;
  int iVar1;
  uint uVar2;
  uint uVar6;
  uint uVar7;
  undefined1 auVar3 [16];
  uint uVar8;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar9;
  uint uVar13;
  uint uVar14;
  undefined1 auVar10 [16];
  uint uVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar10._4_4_ = r2;
  auVar10._0_4_ = r2;
  auVar10._8_4_ = r2;
  auVar10._12_4_ = r2;
  auVar3._4_4_ = r1;
  auVar3._0_4_ = r1;
  auVar3._8_4_ = r1;
  auVar3._12_4_ = r1;
  auVar17._8_4_ = 1;
  auVar17._0_8_ = 0x1000000010000;
  auVar17._12_4_ = 1;
  uVar2 = ((int)(r1 * 0x1000000) >> 0x18) - ((int)(r2 * 0x1000000) >> 0x18);
  uVar6 = ((int)(r1 * 0x10000) >> 0x18) - ((int)(r2 * 0x10000) >> 0x18);
  uVar7 = ((int)((auVar3._8_8_ & 0xffffffff) * 0x100) >> 0x18) -
          ((int)((auVar10._8_8_ & 0xffffffff) * 0x100) >> 0x18);
  uVar8 = ((int)r1 >> 0x18) - ((int)((auVar17._8_8_ & 0xffffffff) * (ulong)r2) >> 0x18);
  uVar9 = (int)uVar2 >> 0x1f;
  uVar13 = (int)uVar6 >> 0x1f;
  uVar14 = (int)uVar7 >> 0x1f;
  uVar15 = (int)uVar8 >> 0x1f;
  auVar4._0_4_ = (uVar2 ^ uVar9) - uVar9;
  auVar4._4_4_ = (uVar6 ^ uVar13) - uVar13;
  auVar4._8_4_ = (uVar7 ^ uVar14) - uVar14;
  auVar4._12_4_ = (uVar8 ^ uVar15) - uVar15;
  auVar11._8_4_ = 0x1000000;
  auVar11._0_8_ = 0x10000000100;
  auVar11._12_4_ = 0x1000000;
  auVar12._4_4_ = auVar4._4_4_ * 2;
  auVar12._0_4_ = auVar4._0_4_ * 2;
  auVar12._8_4_ = auVar4._8_4_ * 2;
  auVar12._12_4_ = auVar4._12_4_ * 2;
  auVar12 = auVar12 ^ auVar4;
  auVar16._0_8_ = auVar12._8_8_;
  auVar16._8_4_ = auVar12._8_4_;
  auVar16._12_4_ = auVar12._12_4_;
  auVar5._0_4_ = -(uint)(0x7ffffeff < (int)(auVar4._0_4_ - 0x80 ^ 0x80000000));
  auVar5._4_4_ = -(uint)(0x7ffffeff < (int)(auVar4._4_4_ - 0x80U ^ 0x80000000));
  auVar5._8_4_ = -(uint)(0x7ffffeff < (int)(auVar4._8_4_ - 0x80U ^ 0x80000000));
  auVar5._12_4_ = -(uint)(0x7ffffeff < (int)(auVar4._12_4_ - 0x80 ^ 0x80000000));
  iVar1 = movmskps(in_ECX,auVar5);
  uVar2 = (uint)(iVar1 != 0xf) << 0x1f;
  env->PSW_USB_V = uVar2;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar2;
  uVar2 = (SUB164(auVar16 | auVar12,4) | SUB164(auVar16 | auVar12,0)) << 0x18;
  env->PSW_USB_AV = uVar2;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar2;
  return (uint)((auVar11._8_8_ & 0xffffffff) * (ulong)auVar4._12_4_) | auVar4._4_4_ * 0x100 |
         (uint)((auVar4._8_8_ & 0xffffffff) * 0x10000) | auVar4._0_4_;
}

Assistant:

uint32_t helper_absdif_b(CPUTriCoreState *env, target_ulong r1, target_ulong r2)
{
    int32_t b, i;
    int32_t extr_r2;
    int32_t ovf = 0;
    int32_t avf = 0;
    int32_t ret = 0;

    for (i = 0; i < 4; i++) {
        extr_r2 = sextract32(r2, i * 8, 8);
        b = sextract32(r1, i * 8, 8);
        b = (b > extr_r2) ? (b - extr_r2) : (extr_r2 - b);
        ovf |= (b > 0x7F) || (b < -0x80);
        avf |= b ^ b * 2u;
        ret |= (b & 0xff) << (i * 8);
    }

    env->PSW_USB_V = ovf << 31;
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 24;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    return ret;
}